

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.cpp
# Opt level: O1

void __thiscall rtb::Concurrency::Queue<int>::unsubscribe(Queue<int> *this)

{
  map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  int iVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  int iVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::thread::id,_int>_>,_std::_Rb_tree_iterator<std::pair<const_std::thread::id,_int>_>_>
  pVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
  pVar12;
  unique_lock<std::mutex> mlock;
  key_type local_48;
  unique_lock<std::mutex> local_40;
  int iVar10;
  
  local_40._M_device = &this->mutex_;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  bVar5 = someoneSlowerThanMe(this);
  this_00 = &this->subscribersMissingRead_;
  if (bVar5) {
    local_48._M_thread = pthread_self();
    pVar11 = std::
             _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::equal_range(&this_00->_M_t,&local_48);
    std::
    _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node);
  }
  else {
    p_Var8 = (this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      while ((_Rb_tree_header *)p_Var6 != p_Var1) {
        p_Var7 = p_Var6;
        if (*(int *)&p_Var6[1]._M_parent <= *(int *)&p_Var8[1]._M_parent) {
          p_Var7 = p_Var8;
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        p_Var8 = p_Var7;
      }
    }
    iVar3 = *(int *)&p_Var8[1]._M_parent;
    local_48._M_thread = pthread_self();
    pVar11 = std::
             _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::equal_range(&this_00->_M_t,&local_48);
    std::
    _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar11.first._M_node,(_Base_ptr)pVar11.second._M_node);
    if ((this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      iVar10 = 0;
    }
    else {
      p_Var8 = (this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var8 != p_Var1) {
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        while ((_Rb_tree_header *)p_Var6 != p_Var1) {
          p_Var7 = p_Var6;
          if (*(int *)&p_Var6[1]._M_parent <= *(int *)&p_Var8[1]._M_parent) {
            p_Var7 = p_Var8;
          }
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
          p_Var8 = p_Var7;
        }
      }
      iVar10 = *(int *)&p_Var8[1]._M_parent;
    }
    iVar9 = iVar10 - iVar3;
    if (iVar9 != 0 && iVar3 <= iVar10) {
      do {
        p_Var4 = (this->queue_).
                 super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl.
                 _M_node.super__List_node_base._M_next;
        psVar2 = &(this->queue_).
                  super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl
                  ._M_node._M_size;
        *psVar2 = *psVar2 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var4,0x18);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
  }
  local_48._M_thread = pthread_self();
  pVar12 = std::
           _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>,_std::_Select1st<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
           ::equal_range(&(this->subscribersNextRead_)._M_t,&local_48);
  std::
  _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>,_std::_Select1st<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
  ::_M_erase_aux(&(this->subscribersNextRead_)._M_t,(_Base_ptr)pVar12.first._M_node,
                 (_Base_ptr)pVar12.second._M_node);
  std::unique_lock<std::mutex>::unlock(&local_40);
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void Queue<T>::unsubscribe() {
        std::unique_lock<std::mutex> mlock(mutex_);

        int myMsgToRead = 0;
        if (!someoneSlowerThanMe()) {
            int myMsgToRead = std::max_element(
                subscribersMissingRead_.begin(), subscribersMissingRead_.end(), pred)
                                  ->second;
            subscribersMissingRead_.erase(std::this_thread::get_id());
            int otherMaxMsgToRead = 0;
            if (subscribersMissingRead_.size() != 0)
                otherMaxMsgToRead = std::max_element(
                    subscribersMissingRead_.begin(), subscribersMissingRead_.end(), pred)
                                        ->second;
            for (int i = 0; i < (otherMaxMsgToRead - myMsgToRead); ++i)
                queue_.pop_front();
        } else
            subscribersMissingRead_.erase(std::this_thread::get_id());

        subscribersNextRead_.erase(std::this_thread::get_id());

        mlock.unlock();
    }